

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_get_entropy_contexts
               (BLOCK_SIZE plane_bsize,macroblockd_plane *pd,ENTROPY_CONTEXT *t_above,
               ENTROPY_CONTEXT *t_left)

{
  ENTROPY_CONTEXT *in_RDX;
  ENTROPY_CONTEXT *in_RSI;
  undefined1 in_DIL;
  BLOCK_SIZE unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  get_entropy_contexts_plane
            (unaff_retaddr,(macroblockd_plane *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_RSI,
             in_RDX);
  return;
}

Assistant:

void av1_get_entropy_contexts(BLOCK_SIZE plane_bsize,
                              const struct macroblockd_plane *pd,
                              ENTROPY_CONTEXT t_above[MAX_MIB_SIZE],
                              ENTROPY_CONTEXT t_left[MAX_MIB_SIZE]) {
  assert(plane_bsize < BLOCK_SIZES_ALL);
  get_entropy_contexts_plane(plane_bsize, pd, t_above, t_left);
}